

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O0

void __thiscall
sglr::ReferenceContext::deleteRenderbuffers
          (ReferenceContext *this,int numRenderbuffers,deUint32 *renderbuffers)

{
  Renderbuffer *local_40;
  Renderbuffer *renderbuffer;
  deUint32 name;
  int i;
  deUint32 *renderbuffers_local;
  int numRenderbuffers_local;
  ReferenceContext *this_local;
  
  for (renderbuffer._4_4_ = 0; renderbuffer._4_4_ < numRenderbuffers;
      renderbuffer._4_4_ = renderbuffer._4_4_ + 1) {
    if (renderbuffers[renderbuffer._4_4_] == 0) {
      local_40 = (Renderbuffer *)0x0;
    }
    else {
      local_40 = rc::ObjectManager<sglr::rc::Renderbuffer>::find
                           (&this->m_renderbuffers,renderbuffers[renderbuffer._4_4_]);
    }
    if (local_40 != (Renderbuffer *)0x0) {
      deleteRenderbuffer(this,local_40);
    }
  }
  return;
}

Assistant:

void ReferenceContext::deleteRenderbuffers (int numRenderbuffers, const deUint32* renderbuffers)
{
	for (int i = 0; i < numRenderbuffers; i++)
	{
		deUint32		name			= renderbuffers[i];
		Renderbuffer*	renderbuffer	= name ? m_renderbuffers.find(name) : DE_NULL;

		if (renderbuffer)
			deleteRenderbuffer(renderbuffer);
	}
}